

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O0

void __thiscall
TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test::TestBody
          (TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer *this_01;
  allocator<unsigned_char> *this_02;
  bool bVar1;
  iterator __first;
  iterator __last;
  size_type num;
  element_type *__dest;
  uchar *__src;
  size_type __n;
  element_type *__first_00;
  element_type *peVar2;
  char *message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *matcher;
  AssertHelper local_168;
  Message local_160;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_158;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_140;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  undefined1 local_110 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer2;
  shared_ptr<const_unsigned_char> r;
  pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_> local_d8;
  undefined1 local_c0 [8];
  shared_ptr<unsigned_char> ptr;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  extent<unsigned_char> t1;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer1;
  TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test *this_local;
  
  buffer1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0x400001,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  __first = std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  __last = std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,'\0');
  pstore::extent<unsigned_char>::extent((extent<unsigned_char> *)&transaction.lock_.owned_);
  pstore::begin((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)
                &ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                &(this->super_TwoConnections).first);
  num = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  std::shared_ptr<unsigned_char>::shared_ptr((shared_ptr<unsigned_char> *)local_c0);
  pstore::transaction_base::alloc_rw<unsigned_char,void>
            (&local_d8,
             (transaction_base *)
             &ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,num);
  this_00 = &r.super___shared_ptr<const_unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::tie<std::shared_ptr<unsigned_char>,pstore::typed_address<unsigned_char>>
            ((shared_ptr<unsigned_char> *)this_00,(typed_address<unsigned_char> *)local_c0);
  std::tuple<std::shared_ptr<unsigned_char>&,pstore::typed_address<unsigned_char>&>::operator=
            ((tuple<std::shared_ptr<unsigned_char>&,pstore::typed_address<unsigned_char>&> *)this_00
             ,&local_d8);
  std::pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_>::~pair(&local_d8)
  ;
  __dest = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
  __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  memcpy(__dest,__src,__n);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)local_c0);
  pstore::transaction_base::commit
            ((transaction_base *)
             &ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>::~transaction
            ((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)
             &ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pstore::database::sync(&(this->super_TwoConnections).second);
  pstore::database::getro<unsigned_char,void>
            ((database *)
             &buffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (extent<unsigned_char> *)&(this->super_TwoConnections).second);
  this_01 = &buffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __first_00 = std::__shared_ptr<const_unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<const_unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)this_01);
  peVar2 = std::__shared_ptr<const_unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<const_unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)this_01);
  this_02 = (allocator<unsigned_char> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<unsigned_char>::allocator(this_02);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_110,__first_00,
             peVar2 + num,this_02);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::ContainerEq<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_158,(testing *)local_28,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            (&local_140,(internal *)&local_158,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::operator()(local_128,(char *)&local_140,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)"buffer2");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_140);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~PolymorphicMatcher(&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
  std::shared_ptr<const_unsigned_char>::~shared_ptr
            ((shared_ptr<const_unsigned_char> *)
             &buffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionMapsAdditionalSpace) {
    using ::testing::ContainerEq;

    // The first connection write > min_region_size bytes in a transaction.
    std::vector<std::uint8_t> buffer1 (pstore::storage::min_region_size + 1);
    std::iota (std::begin (buffer1), std::end (buffer1), std::uint8_t{0});

    pstore::extent<std::uint8_t> t1;
    {
        auto transaction = pstore::begin (first);
        {
            t1.size = buffer1.size ();
            std::shared_ptr<std::uint8_t> ptr;
            std::tie (ptr, t1.addr) = transaction.alloc_rw<std::uint8_t> (t1.size);
            std::memcpy (ptr.get (), buffer1.data (), buffer1.size ());
        }

        transaction.commit ();
    }

    second.sync ();
    auto r = second.getro (t1);
    std::vector<std::uint8_t> buffer2 (r.get (), r.get () + t1.size);
    EXPECT_THAT (buffer2, ContainerEq (buffer1));
}